

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_> *
__thiscall
CfgNode::BlockData::signalHandlers
          (set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
           *__return_storage_ptr__,BlockData *this)

{
  _Base_ptr p_Var1;
  _Base_ptr local_40;
  insert_iterator<std::set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>_>
  local_38;
  
  local_38.iter._M_node = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       local_38.iter._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38.iter._M_node;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38.container = __return_storage_ptr__;
  for (p_Var1 = (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_40 = p_Var1[1]._M_parent;
    std::
    insert_iterator<std::set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>_>
    ::operator=(&local_38,(value_type *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgSignalHandler*> CfgNode::BlockData::signalHandlers() const {
	std::set<CfgSignalHandler*> cfgSignalHandlers;

	std::transform(m_signalHandlers.begin(), m_signalHandlers.end(),
			std::inserter(cfgSignalHandlers, cfgSignalHandlers.begin()),
			[](const std::map<int, CfgSignalHandler*>::value_type &pair) {
					return pair.second;
			}
	);

	return cfgSignalHandlers;
}